

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_node.cc
# Opt level: O1

RC __thiscall QL_Node::IndexToOffset(QL_Node *this,int index,int *offset,int *length)

{
  int iVar1;
  QL_Manager *pQVar2;
  int *piVar3;
  long lVar4;
  
  *offset = 0;
  if (0 < this->attrsInRecSize) {
    pQVar2 = this->qlm;
    piVar3 = this->attrsInRec;
    lVar4 = 0;
    do {
      iVar1 = piVar3[lVar4];
      if (iVar1 == index) {
        *length = this->qlm->attrEntries[iVar1].attrLength;
        return 0;
      }
      *offset = *offset + pQVar2->attrEntries[iVar1].attrLength;
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->attrsInRecSize);
  }
  return 0x194;
}

Assistant:

RC QL_Node::IndexToOffset(int index, int &offset, int &length){
  offset = 0;
  for(int i=0; i < attrsInRecSize; i++){
    if(attrsInRec[i] == index){
      length = qlm.attrEntries[attrsInRec[i]].attrLength;
      return (0);
    }
    offset += qlm.attrEntries[attrsInRec[i]].attrLength;
  }
  return (QL_ATTRNOTFOUND);
}